

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O0

void sei_dump_messages(sei_message_t *head,double timestamp)

{
  sei_msgtype_t sVar1;
  libcaption_stauts_t lVar2;
  cea708_t *cea708_00;
  sei_message_t *in_RDI;
  size_t size;
  uint8_t *data;
  sei_message_t *msg;
  cea708_t cea708;
  cea708_t *in_stack_ffffffffffffff18;
  cea708_t *in_stack_ffffffffffffff20;
  FILE *__stream;
  size_t local_c8;
  byte *local_c0;
  sei_message_t *local_b8;
  
  cea708_init(in_stack_ffffffffffffff20,(double)in_stack_ffffffffffffff18);
  for (local_b8 = in_RDI; local_b8 != (sei_message_t *)0x0; local_b8 = sei_message_next(local_b8)) {
    local_c0 = sei_message_data(local_b8);
    local_c8 = sei_message_size(local_b8);
    __stream = _stderr;
    sVar1 = sei_message_type(local_b8);
    fprintf(__stream,"-- Message %p\n-- Message Type: %d\n-- Message Size: %d\n",local_c0,
            (ulong)sVar1,local_c8 & 0xffffffff);
    for (; local_c8 != 0; local_c8 = local_c8 - 1) {
      fprintf(_stderr,"%02X ",(ulong)*local_c0);
      local_c0 = local_c0 + 1;
    }
    fprintf(_stderr,"\n");
    sVar1 = sei_message_type(local_b8);
    if (sVar1 == sei_type_user_data_registered_itu_t_t35) {
      cea708_00 = (cea708_t *)sei_message_data(local_b8);
      sei_message_size(local_b8);
      lVar2 = cea708_parse_h262((uint8_t *)__stream,(size_t)cea708_00,in_stack_ffffffffffffff18);
      if (lVar2 == LIBCAPTION_OK) {
        cea708_dump(cea708_00);
      }
      else {
        fprintf(_stderr,"cea708_parse error\n");
      }
    }
  }
  return;
}

Assistant:

void sei_dump_messages(sei_message_t* head, double timestamp)
{
    cea708_t cea708;
    sei_message_t* msg;
    cea708_init(&cea708, timestamp);

    for (msg = head; msg; msg = sei_message_next(msg)) {
        uint8_t* data = sei_message_data(msg);
        size_t size = sei_message_size(msg);
        fprintf(stderr, "-- Message %p\n-- Message Type: %d\n-- Message Size: %d\n", data, sei_message_type(msg), (int)size);

        while (size) {
            fprintf(stderr, "%02X ", *data);
            ++data;
            --size;
        }

        fprintf(stderr, "\n");

        if (sei_type_user_data_registered_itu_t_t35 == sei_message_type(msg)) {
            if (LIBCAPTION_OK != cea708_parse_h262(sei_message_data(msg), sei_message_size(msg), &cea708)) {
                fprintf(stderr, "cea708_parse error\n");
            } else {
                cea708_dump(&cea708);
            }
        }
    }
}